

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

string * __thiscall
leveldb::ParsedInternalKey::DebugString_abi_cxx11_
          (string *__return_storage_ptr__,ParsedInternalKey *this)

{
  ostream *poVar1;
  Slice *value;
  pointer local_1f8;
  size_type sStack_1f0;
  string local_1e8;
  string local_1c8;
  ostringstream ss;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ss);
  poVar1 = std::operator<<((ostream *)&ss,'\'');
  Slice::ToString_abi_cxx11_(&local_1e8,&this->user_key);
  local_1f8 = local_1e8._M_dataplus._M_p;
  sStack_1f0 = local_1e8._M_string_length;
  EscapeString_abi_cxx11_(&local_1c8,(leveldb *)&local_1f8,value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c8);
  poVar1 = std::operator<<(poVar1,"\' @ ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," : ");
  std::ostream::operator<<(poVar1,this->type);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}